

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildPlusMinus(CNscPStackEntry *pValue,int fPlus,int fPre)

{
  bool bVar1;
  NscType NVar2;
  CNscPStackEntry *this;
  uchar *puVar3;
  uint uVar4;
  int in_EDX;
  int in_ESI;
  CNscPStackEntry *in_RDI;
  NscPCodeVariable *pv;
  NscType nType;
  CNscPStackEntry *pOut;
  undefined4 in_stack_ffffffffffffffb8;
  NscType in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  CNscPStackEntry *in_stack_ffffffffffffffc8;
  CNscPStackEntry *in_stack_ffffffffffffffd0;
  
  this = CNscContext::GetPStackEntry
                   ((CNscContext *)in_stack_ffffffffffffffc0,
                    (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  bVar1 = CNscContext::IsPhase2(g_pCtx);
  if ((bVar1) || (bVar1 = CNscContext::IsNWScript(g_pCtx), bVar1)) {
    if (in_RDI == (CNscPStackEntry *)0x0) {
      __assert_fail("pValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                    ,0xa2e,"CNscPStackEntry *NscBuildPlusMinus(CNscPStackEntry *, int, int)");
    }
    NVar2 = CNscPStackEntry::GetType(in_RDI);
    if (NVar2 == NscType_Error) {
      CNscPStackEntry::SetType
                ((CNscPStackEntry *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    else if ((NVar2 == NscType_Integer) &&
            (bVar1 = CNscPStackEntry::IsSimpleVariable((CNscPStackEntry *)0x1ff7d5), bVar1)) {
      CNscPStackEntry::AppendData(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      puVar3 = CNscPStackEntry::GetData(this);
      if (in_ESI == 0) {
        uVar4 = 0x20;
        if (in_EDX != 0) {
          uVar4 = 0x10;
        }
        *(uint *)(puVar3 + 0x28) = uVar4 | *(uint *)(puVar3 + 0x28);
      }
      else {
        uVar4 = 8;
        if (in_EDX != 0) {
          uVar4 = 4;
        }
        *(uint *)(puVar3 + 0x28) = uVar4 | *(uint *)(puVar3 + 0x28);
      }
      CNscPStackEntry::SetType
                ((CNscPStackEntry *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    else {
      if (in_ESI == 0) {
        in_stack_ffffffffffffffc0 = "--";
      }
      else {
        in_stack_ffffffffffffffc0 = "++";
      }
      CNscContext::GenerateMessage
                (g_pCtx,NscMessage_ErrorOperatorTypeMismatch,in_stack_ffffffffffffffc0);
      CNscPStackEntry::SetType
                ((CNscPStackEntry *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    CNscContext::FreePStackEntry
              ((CNscContext *)in_stack_ffffffffffffffc0,
               (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  else {
    if (in_RDI != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                ((CNscContext *)in_stack_ffffffffffffffc0,
                 (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    CNscPStackEntry::SetType((CNscPStackEntry *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc)
    ;
  }
  return this;
}

Assistant:

YYSTYPE NscBuildPlusMinus (YYSTYPE pValue, int fPlus, int fPre)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pValue)
			g_pCtx ->FreePStackEntry (pValue);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Get the value
	//

	assert (pValue);

	//
	// Check for an error
	//

	NscType nType = pValue ->GetType ();
	if (nType == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Process the operator
	//

	else if (nType == NscType_Integer && pValue ->IsSimpleVariable ())
	{
		pOut ->AppendData (pValue);
		NscPCodeVariable *pv = (NscPCodeVariable *) pOut ->GetData ();
		if (fPlus)
			pv ->ulFlags |= fPre ? NscSymFlag_PreIncrement : NscSymFlag_PostIncrement;
		else
			pv ->ulFlags |= fPre ? NscSymFlag_PreDecrement : NscSymFlag_PostDecrement;
		pOut ->SetType (nType);
	}
	else
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, fPlus ? "++" : "--");
		pOut ->SetType (NscType_Error);
	}

	//
	// Rundown
	//

    g_pCtx ->FreePStackEntry (pValue);
	return pOut;
}